

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semicircle.hpp
# Opt level: O2

bool __thiscall
boost::geometry::model::
semicircle<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>::
intersects_point<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>
          (semicircle<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>
           *this,point<double,_2UL,_boost::geometry::cs::cartesian> *p)

{
  bool bVar1;
  int iVar2;
  longdouble in_ST0;
  double dVar3;
  double dVar4;
  point<double,_2UL,_boost::geometry::cs::cartesian> pVar5;
  
  iVar2 = strategy::side::side_by_triangle<void>::
          apply<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>,boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>,boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>
                    ((point<double,_2UL,_boost::geometry::cs::cartesian> *)this,
                     (point<double,_2UL,_boost::geometry::cs::cartesian> *)(this + 0x10),p);
  if (iVar2 == *(short *)(this + 0x20)) {
    pVar5 = return_centroid<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>,boost::geometry::model::segment<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>>
                      ((segment<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
                        *)this);
    dVar4 = pVar5.m_values[1] - p->m_values[1];
    dVar3 = pVar5.m_values[0] - p->m_values[0];
    resolve_strategy::length::
    apply<boost::geometry::model::segment<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>>
              (this);
    bVar1 = (longdouble)SQRT(dVar4 * dVar4 + dVar3 * dVar3 + 0.0) <= in_ST0 * (longdouble)0.5;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool intersects_point(OtherPoint const &p) const
    {
        return strategy::side::side_by_triangle<>::apply(s.first, s.second, p) == side
        && geometry::distance(return_centroid<Point>(s), p) <= geometry::length(s) / 2;
    }